

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_bagwell.h
# Opt level: O2

void __thiscall vector_bagwell<int,_16U>::clear(vector_bagwell<int,_16U> *this)

{
  pointer ppiVar1;
  pointer ppiVar2;
  uint uVar3;
  
  uVar3 = 0;
  while( true ) {
    ppiVar1 = (this->_index_block).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppiVar2 = (this->_index_block).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppiVar2 - (long)ppiVar1 >> 3) <= (ulong)uVar3) break;
    free(ppiVar1[uVar3]);
    uVar3 = uVar3 + 1;
  }
  if (ppiVar2 != ppiVar1) {
    (this->_index_block).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppiVar1;
  }
  this->_insertpos = (int *)0x0;
  this->_left_in_block = 0;
  return;
}

Assistant:

void clear()
	{
		for (unsigned i=0; i < _index_block.size(); ++i) {
			free(_index_block[i]);
		}
		_index_block.clear();
		_insertpos = 0;
		_left_in_block = 0;
	}